

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O1

void __thiscall
FStringTable::FindString(FStringTable *this,char *name,StringEntry ***pentry1,StringEntry **entry1)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  StringEntry *pSVar4;
  StringEntry *pSVar5;
  StringEntry *pSVar6;
  
  uVar2 = MakeKey(name);
  pSVar5 = (StringEntry *)(this->Buckets + (uVar2 & 0x7f));
  pSVar6 = ((StringEntry *)(this->Buckets + (uVar2 & 0x7f)))->Next;
  do {
    if (pSVar6 == (StringEntry *)0x0) {
      *pentry1 = &pSVar5->Next;
      *entry1 = (StringEntry *)0x0;
      return;
    }
    iVar3 = strcasecmp(pSVar6->Name,name);
    if (iVar3 == 1) {
      *pentry1 = &pSVar5->Next;
      *entry1 = (StringEntry *)0x0;
LAB_0048b65a:
      bVar1 = false;
      pSVar4 = pSVar6;
      pSVar6 = pSVar5;
    }
    else {
      if (iVar3 == 0) {
        *pentry1 = &pSVar5->Next;
        *entry1 = pSVar6;
        goto LAB_0048b65a;
      }
      pSVar4 = pSVar6->Next;
      bVar1 = true;
    }
    pSVar5 = pSVar6;
    pSVar6 = pSVar4;
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void FStringTable::FindString (const char *name, StringEntry **&pentry1, StringEntry *&entry1)
{
	DWORD bucket = MakeKey (name) & (HASH_SIZE - 1);
	StringEntry **pentry = &Buckets[bucket], *entry = *pentry;

	while (entry != NULL)
	{
		int cmpval = stricmp (entry->Name, name);
		if (cmpval == 0)
		{
			pentry1 = pentry;
			entry1 = entry;
			return;
		}
		if (cmpval == 1)
		{
			pentry1 = pentry;
			entry1 = NULL;
			return;
		}
		pentry = &entry->Next;
		entry = *pentry;
	}
	pentry1 = pentry;
	entry1 = entry;
}